

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
               (Nonzero<double> *keys,int end,ElementCompare *compare,int start,bool type)

{
  Nonzero<double> *pNVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  Nonzero<double> *pNVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  
  if (start + 1 < end) {
    uVar15 = end - 1;
    uVar13 = uVar15 - start;
    if (0x18 < (int)uVar13) {
LAB_002226fe:
      iVar14 = (uVar13 >> 1) + start;
      pNVar1 = keys + iVar14;
      dVar2 = keys[iVar14].val;
      lVar9 = (long)(int)uVar15;
      lVar7 = (long)start;
      uVar5 = uVar15;
      uVar13 = start;
      do {
        uVar6 = (ulong)uVar5;
        uVar12 = uVar13;
        if ((type & 1U) == 0) {
          if ((int)uVar13 < (int)uVar15) {
            pNVar10 = keys + (int)uVar13;
            lVar11 = 0;
            do {
              if ((compare->epsiloncompare < ABS(pNVar10->val - dVar2)) && (dVar2 <= pNVar10->val))
              {
                uVar12 = uVar13 - (int)lVar11;
                break;
              }
              lVar11 = lVar11 + -1;
              pNVar10 = pNVar10 + 1;
              uVar12 = uVar15;
            } while (-lVar9 + (long)(int)uVar13 != lVar11);
          }
          if (start < (int)uVar5) {
            uVar6 = (ulong)(int)uVar5;
            pNVar10 = keys + uVar6;
            do {
              if ((ABS(pNVar10->val - dVar2) <= compare->epsiloncompare) || (pNVar10->val < dVar2))
              goto LAB_0022284b;
              uVar6 = uVar6 - 1;
              pNVar10 = pNVar10 + -1;
            } while (lVar7 < (long)uVar6);
            goto LAB_00222849;
          }
        }
        else {
          if ((int)uVar13 < (int)uVar15) {
            pNVar10 = keys + (int)uVar13;
            lVar11 = 0;
            do {
              if ((ABS(pNVar10->val - dVar2) <= compare->epsiloncompare) || (dVar2 <= pNVar10->val))
              {
                uVar12 = uVar13 - (int)lVar11;
                break;
              }
              lVar11 = lVar11 + -1;
              pNVar10 = pNVar10 + 1;
              uVar12 = uVar15;
            } while (-lVar9 + (long)(int)uVar13 != lVar11);
          }
          if (start < (int)uVar5) {
            uVar6 = (ulong)(int)uVar5;
            pNVar10 = keys + uVar6;
            do {
              if ((compare->epsiloncompare < ABS(pNVar10->val - dVar2)) && (pNVar10->val < dVar2))
              goto LAB_0022284b;
              uVar6 = uVar6 - 1;
              pNVar10 = pNVar10 + -1;
            } while (lVar7 < (long)uVar6);
LAB_00222849:
            uVar6 = (ulong)(uint)start;
          }
        }
LAB_0022284b:
        uVar5 = (uint)uVar6;
        if ((int)uVar5 <= (int)uVar12) goto LAB_00222890;
        dVar3 = keys[(int)uVar12].val;
        iVar14 = keys[(int)uVar12].idx;
        keys[(int)uVar12].idx = keys[(int)uVar5].idx;
        keys[(int)uVar12].val = keys[(int)uVar5].val;
        keys[(int)uVar5].val = dVar3;
        keys[(int)uVar5].idx = iVar14;
        uVar13 = uVar12 + 1;
        uVar5 = uVar5 - 1;
      } while( true );
    }
LAB_002229ef:
    if (0 < (int)uVar13) {
      SPxShellsort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
                (keys,uVar15,compare,start);
      return;
    }
  }
  return;
LAB_00222890:
  if ((type & 1U) == 0) {
    if (start < (int)uVar5) {
      uVar6 = (ulong)(int)uVar5;
      pNVar10 = keys + uVar6;
      do {
        if ((compare->epsiloncompare < ABS(dVar2 - pNVar10->val)) && (pNVar10->val <= dVar2))
        goto LAB_00222927;
        uVar6 = uVar6 - 1;
        pNVar10 = pNVar10 + -1;
      } while (lVar7 < (long)uVar6);
      uVar6 = (ulong)(uint)start;
    }
LAB_00222927:
    uVar5 = (uint)uVar6;
    if (uVar5 == uVar15) {
      dVar2 = keys[lVar9].val;
      iVar14 = keys[lVar9].idx;
      keys[lVar9].idx = pNVar1->idx;
      keys[lVar9].val = pNVar1->val;
      pNVar1->val = dVar2;
      pNVar1->idx = iVar14;
      uVar5 = uVar15 - 1;
    }
  }
  else {
    uVar13 = uVar12;
    if ((int)uVar12 < (int)uVar15) {
      pNVar10 = keys + (int)uVar12;
      lVar11 = 0;
      do {
        if ((compare->epsiloncompare < ABS(dVar2 - pNVar10->val)) && (dVar2 < pNVar10->val)) {
          uVar13 = uVar12 - (int)lVar11;
          break;
        }
        lVar11 = lVar11 + -1;
        pNVar10 = pNVar10 + 1;
        uVar13 = uVar15;
      } while ((int)uVar12 - lVar9 != lVar11);
    }
    uVar12 = uVar13;
    if (uVar12 == start) {
      dVar2 = keys[lVar7].val;
      iVar14 = keys[lVar7].idx;
      keys[lVar7].idx = pNVar1->idx;
      keys[lVar7].val = pNVar1->val;
      pNVar1->val = dVar2;
      pNVar1->idx = iVar14;
      uVar12 = start + 1;
    }
  }
  uVar8 = uVar5 - start;
  uVar13 = uVar15 - uVar12;
  if ((int)uVar13 < (int)uVar8) {
    bVar4 = (int)uVar15 <= (int)uVar12;
    uVar16 = uVar5;
    uVar13 = uVar8;
    uVar5 = uVar15;
    uVar15 = uVar12;
    uVar12 = start;
    if (bVar4) goto LAB_002229cf;
  }
  else {
    bVar4 = (int)uVar5 <= start;
    uVar16 = uVar15;
    uVar15 = start;
    start = uVar12;
    if (bVar4) goto LAB_002229cf;
  }
  SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
            (keys,uVar5 + 1,compare,uVar15,(bool)(~type & 1));
  start = uVar12;
LAB_002229cf:
  uVar15 = uVar16;
  type = (bool)(type ^ 1);
  if ((int)uVar13 < 0x19) goto LAB_002229ef;
  goto LAB_002226fe;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}